

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void whitespace_suite::test_empty(void)

{
  char input [1];
  decoder_type decoder;
  value_type local_141;
  undefined4 local_140;
  value local_13c;
  basic_decoder<char> local_138;
  
  local_138.input.head = &local_141;
  local_141 = '\0';
  local_138.input.tail = local_138.input.head;
  memset(&local_138.current,0,0x120);
  local_138.current.code = uninitialized;
  local_138.current.view.head = (const_pointer)0x0;
  local_138.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_138);
  local_13c = local_138.current.code;
  local_140 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a,"void whitespace_suite::test_empty()",&local_13c,&local_140);
  return;
}

Assistant:

void test_empty()
{
    const char input[] = "";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}